

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_constant_names.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  unsigned_long max;
  unsigned_value_type uStack_20;
  
  if (1 < argc) {
    pcVar2 = argv[1];
    iVar1 = strcmp(pcVar2,"help");
    if ((iVar1 != 0) && (iVar1 = strcmp(pcVar2,"--help"), iVar1 != 0)) {
      iVar1 = strcmp(pcVar2,"error");
      if ((iVar1 == 0) || (iVar1 = strcmp(pcVar2,"status"), iVar1 == 0)) {
        iVar1 = process_signed(TYPE_STATUS,-0x80000000,0x7fffffff,argv + 2);
        return iVar1;
      }
      iVar1 = strcmp(pcVar2,"alg");
      if ((iVar1 == 0) || (iVar1 = strcmp(pcVar2,"algorithm"), iVar1 == 0)) {
        max = 0xffffffff;
        uStack_20 = TYPE_ALGORITHM;
      }
      else {
        iVar1 = strcmp(pcVar2,"curve");
        if ((iVar1 == 0) || (iVar1 = strcmp(pcVar2,"ecc_curve"), iVar1 == 0)) {
          uStack_20 = TYPE_ECC_CURVE;
        }
        else {
          iVar1 = strcmp(pcVar2,"group");
          if ((iVar1 != 0) && (iVar1 = strcmp(pcVar2,"dh_group"), iVar1 != 0)) {
            iVar1 = strcmp(pcVar2,"type");
            if ((iVar1 == 0) || (iVar1 = strcmp(pcVar2,"key_type"), iVar1 == 0)) {
              uStack_20 = TYPE_KEY_TYPE;
              max = 0xffff;
            }
            else {
              iVar1 = strcmp(pcVar2,"usage");
              if ((iVar1 != 0) && (iVar1 = strcmp(pcVar2,"key_usage"), iVar1 != 0)) {
                printf("Unknown type: %s\n",pcVar2);
                return 1;
              }
              uStack_20 = TYPE_KEY_USAGE;
              max = 0xffffffff;
            }
            goto LAB_00103163;
          }
          uStack_20 = TYPE_DH_GROUP;
        }
        max = 0xff;
      }
LAB_00103163:
      iVar1 = process_unsigned(uStack_20,max,argv + 2);
      return iVar1;
    }
  }
  pcVar2 = "psa_constant_names";
  if (*argv != (char *)0x0) {
    pcVar2 = *argv;
  }
  printf("Usage: %s TYPE VALUE [VALUE...]\n",pcVar2);
  puts("Print the symbolic name whose numerical value is VALUE in TYPE.");
  puts("Supported types (with = between aliases):");
  puts("  alg=algorithm         Algorithm (psa_algorithm_t)");
  puts("  curve=ecc_curve       Elliptic curve identifier (psa_ecc_curve_t)");
  puts("  group=dh_group        Diffie-Hellman group identifier (psa_dh_group_t)");
  puts("  type=key_type         Key type (psa_key_type_t)");
  puts("  usage=key_usage       Key usage (psa_key_usage_t)");
  puts("  error=status          Status code (psa_status_t)");
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc <= 1 ||
        !strcmp(argv[1], "help") ||
        !strcmp(argv[1], "--help"))
    {
        usage(argv[0]);
        return EXIT_FAILURE;
    }

    if (!strcmp(argv[1], "error") || !strcmp(argv[1], "status")) {
        /* There's no way to obtain the actual range of a signed type,
         * so hard-code it here: psa_status_t is int32_t. */
        return process_signed(TYPE_STATUS, INT32_MIN, INT32_MAX,
                              argv + 2);
    } else if (!strcmp(argv[1], "alg") || !strcmp(argv[1], "algorithm")) {
        return process_unsigned(TYPE_ALGORITHM, (psa_algorithm_t) (-1),
                                argv + 2);
    } else if (!strcmp(argv[1], "curve") || !strcmp(argv[1], "ecc_curve")) {
        return process_unsigned(TYPE_ECC_CURVE, (psa_ecc_curve_t) (-1),
                                argv + 2);
    } else if (!strcmp(argv[1], "group") || !strcmp(argv[1], "dh_group")) {
        return process_unsigned(TYPE_DH_GROUP, (psa_dh_group_t) (-1),
                                argv + 2);
    } else if (!strcmp(argv[1], "type") || !strcmp(argv[1], "key_type")) {
        return process_unsigned(TYPE_KEY_TYPE, (psa_key_type_t) (-1),
                                argv + 2);
    } else if (!strcmp(argv[1], "usage") || !strcmp(argv[1], "key_usage")) {
        return process_unsigned(TYPE_KEY_USAGE, (psa_key_usage_t) (-1),
                                argv + 2);
    } else {
        printf("Unknown type: %s\n", argv[1]);
        return EXIT_FAILURE;
    }
}